

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O2

IterateResult __thiscall glcts::MissingQualifierTestGroup::MissingCase::iterate(MissingCase *this)

{
  TestLog *log;
  RenderContext *renderCtx;
  glcts *this_00;
  glUniform4fFunc p_Var1;
  bool bVar2;
  int iVar3;
  GLenum GVar4;
  GLint GVar5;
  undefined4 extraout_var;
  char *pcVar6;
  TestError *this_01;
  GLSLVersion glslVersion;
  char *extensionDirective;
  allocator<char> local_262;
  allocator<char> local_261;
  undefined1 local_260 [32];
  string local_240;
  string local_220;
  string local_200;
  FBOSentry fbo;
  VertexArrayBinding posBinding;
  ShaderProgram p;
  Functions *gl;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  bVar2 = IsExtensionSupported((this->super_TestCase).m_context,"GL_KHR_blend_equation_advanced");
  if (bVar2) {
    extensionDirective = (char *)0x8058;
    FBOSentry::FBOSentry(&fbo,gl,4,4,0x8058);
    (*gl->clearColor)(1.0,1.0,1.0,1.0);
    (*gl->clear)(0x4000);
    renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
    GetDef2DVtxSrc_abi_cxx11_(&local_240,(glcts *)(ulong)this->m_glslVersion,glslVersion);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_260,local_240._M_dataplus._M_p,&local_261);
    this_00 = (glcts *)this->m_layoutQualifier;
    pcVar6 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    GetSolidShader_abi_cxx11_
              (&local_220,this_00,pcVar6,"#extension GL_KHR_blend_equation_advanced : require",
               extensionDirective);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,local_220._M_dataplus._M_p,&local_262);
    glu::makeVtxFragSources((ProgramSources *)&posBinding,(string *)local_260,&local_200);
    glu::ShaderProgram::ShaderProgram(&p,renderCtx,(ProgramSources *)&posBinding);
    glu::ProgramSources::~ProgramSources((ProgramSources *)&posBinding);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)local_260);
    std::__cxx11::string::~string((string *)&local_240);
    if (p.m_program.m_info.linkOk == false) {
      glu::operator<<(log,&p);
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                 ,0x4f7);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*gl->useProgram)(p.m_program.m_program);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"Program failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x4fb);
    (*gl->disable)(0xbd0);
    (*gl->enable)(0xbe2);
    (*gl->blendEquation)(this->m_mode);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"BlendEquation failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x501);
    p_Var1 = gl->uniform4f;
    GVar5 = (*gl->getUniformLocation)(p.m_program.m_program,"uSrcCol");
    (*p_Var1)(GVar5,0.0,0.0,0.0,1.0);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"Uniform failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x505);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_260,"aPos",(allocator<char> *)&local_240);
    glu::va::Float(&posBinding,(string *)local_260,2,4,0,(float *)s_pos);
    std::__cxx11::string::~string((string *)local_260);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"Attributes failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x508);
    local_260._0_8_ = (pointer)0x600000000;
    local_260._8_4_ = INDEXTYPE_UINT16;
    local_260._16_8_ = s_indices;
    glu::draw(((this->super_TestCase).m_context)->m_renderCtx,p.m_program.m_program,1,&posBinding,
              (PrimitiveList *)local_260,(DrawUtilCallback *)0x0);
    GVar4 = (*gl->getError)();
    pcVar6 = "Pass";
    if (GVar4 != 0x502) {
      pcVar6 = "Fail";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(GVar4 != 0x502)
               ,pcVar6);
    std::__cxx11::string::~string((string *)&posBinding.binding.name);
    glu::ShaderProgram::~ShaderProgram(&p);
    FBOSentry::~FBOSentry(&fbo);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
  }
  return STOP;
}

Assistant:

MissingQualifierTestGroup::MissingCase::IterateResult MissingQualifierTestGroup::MissingCase::iterate(void)
{
	const int			  dim = 4;
	const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
	TestLog&			  log = m_testCtx.getLog();

	// Check that extension is supported.
	if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
		return STOP;
	}

	FBOSentry fbo(gl, dim, dim, GL_RGBA8);

	tcu::Vec4 dstCol(1.f, 1.f, 1.f, 1.f);
	tcu::Vec4 srcCol(0.f, 0.f, 0.f, 1.f);

	// Clear to destination color.
	gl.clearColor(dstCol.x(), dstCol.y(), dstCol.z(), dstCol.w());
	gl.clear(GL_COLOR_BUFFER_BIT);

	// Setup program.
	glu::ShaderProgram p(m_context.getRenderContext(),
						 glu::makeVtxFragSources(
							 GetDef2DVtxSrc(m_glslVersion).c_str(),
							 GetSolidShader(m_layoutQualifier, glu::getGLSLVersionDeclaration(m_glslVersion)).c_str()));
	if (!p.isOk())
	{
		log << p;
		TCU_FAIL("Compile failed");
	}

	gl.useProgram(p.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program failed");

	// Enable blending and set blend equation.
	gl.disable(GL_DITHER);
	gl.enable(GL_BLEND);
	gl.blendEquation(m_mode);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BlendEquation failed");

	// Setup source color.
	gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uSrcCol"), srcCol.x(), srcCol.y(), srcCol.z(), srcCol.w());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform failed");

	glu::VertexArrayBinding posBinding = glu::va::Float("aPos", 2, 4, 0, &s_pos[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Attributes failed");

	glu::draw(m_context.getRenderContext(), p.getProgram(), 1, &posBinding,
			  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));

	glw::GLenum error = gl.getError();
	bool		pass  = (error == GL_INVALID_OPERATION);

	m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail");

	return STOP;
}